

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mutexes.c
# Opt level: O1

int run_test_thread_mutex(void)

{
  int iVar1;
  undefined1 *unaff_RBX;
  uv_mutex_t mutex;
  undefined1 auStack_c8 [8];
  code *pcStack_c0;
  undefined1 auStack_b0 [56];
  code *pcStack_78;
  undefined1 auStack_68 [40];
  undefined1 local_30 [40];
  
  iVar1 = uv_mutex_init(local_30);
  if (iVar1 == 0) {
    uv_mutex_lock(local_30);
    uv_mutex_unlock(local_30);
    uv_mutex_destroy(local_30);
    return 0;
  }
  run_test_thread_mutex_cold_1();
  pcStack_78 = (code *)0x16434c;
  iVar1 = uv_mutex_init_recursive(auStack_68);
  if (iVar1 == 0) {
    unaff_RBX = auStack_68;
    pcStack_78 = (code *)0x16435d;
    uv_mutex_lock(unaff_RBX);
    pcStack_78 = (code *)0x164365;
    uv_mutex_lock(unaff_RBX);
    pcStack_78 = (code *)0x16436d;
    iVar1 = uv_mutex_trylock(unaff_RBX);
    if (iVar1 == 0) {
      pcStack_78 = (code *)0x16437e;
      uv_mutex_unlock(auStack_68);
      pcStack_78 = (code *)0x164386;
      uv_mutex_unlock(auStack_68);
      pcStack_78 = (code *)0x16438e;
      uv_mutex_unlock(auStack_68);
      pcStack_78 = (code *)0x164396;
      uv_mutex_destroy(auStack_68);
      return 0;
    }
  }
  else {
    pcStack_78 = (code *)0x1643a3;
    run_test_thread_mutex_recursive_cold_1();
  }
  pcStack_78 = run_test_thread_rwlock;
  run_test_thread_mutex_recursive_cold_2();
  pcStack_c0 = (code *)0x1643b7;
  pcStack_78 = (code *)unaff_RBX;
  iVar1 = uv_rwlock_init(auStack_b0);
  if (iVar1 == 0) {
    pcStack_c0 = (code *)0x1643c8;
    uv_rwlock_rdlock(auStack_b0);
    pcStack_c0 = (code *)0x1643d0;
    uv_rwlock_rdunlock(auStack_b0);
    pcStack_c0 = (code *)0x1643d8;
    uv_rwlock_wrlock(auStack_b0);
    pcStack_c0 = (code *)0x1643e0;
    uv_rwlock_wrunlock(auStack_b0);
    pcStack_c0 = (code *)0x1643e8;
    uv_rwlock_destroy(auStack_b0);
    return 0;
  }
  pcStack_c0 = run_test_thread_rwlock_trylock;
  run_test_thread_rwlock_cold_1();
  pcStack_c0 = (code *)unaff_RBX;
  iVar1 = uv_cond_init(&condvar);
  if (iVar1 == 0) {
    iVar1 = uv_mutex_init(&::mutex);
    if (iVar1 != 0) goto LAB_00164558;
    iVar1 = uv_rwlock_init(&rwlock);
    if (iVar1 != 0) goto LAB_0016455d;
    uv_mutex_lock(&::mutex);
    iVar1 = uv_thread_create(auStack_c8,thread_rwlock_trylock_peer,0);
    if (iVar1 != 0) goto LAB_00164562;
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != 0) goto LAB_00164567;
    synchronize();
    uv_rwlock_wrunlock(&rwlock);
    iVar1 = uv_rwlock_tryrdlock(&rwlock);
    if (iVar1 != 0) goto LAB_0016456c;
    synchronize();
    uv_rwlock_rdunlock(&rwlock);
    synchronize();
    iVar1 = uv_rwlock_tryrdlock(&rwlock);
    if (iVar1 != -0x10) goto LAB_00164571;
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != -0x10) goto LAB_00164576;
    synchronize();
    iVar1 = uv_rwlock_tryrdlock(&rwlock);
    if (iVar1 != 0) goto LAB_0016457b;
    uv_rwlock_rdunlock(&rwlock);
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != -0x10) goto LAB_00164580;
    synchronize();
    iVar1 = uv_thread_join(auStack_c8);
    if (iVar1 == 0) {
      uv_rwlock_destroy(&rwlock);
      uv_mutex_unlock(&::mutex);
      uv_mutex_destroy(&::mutex);
      uv_cond_destroy(&condvar);
      return 0;
    }
  }
  else {
    run_test_thread_rwlock_trylock_cold_1();
LAB_00164558:
    run_test_thread_rwlock_trylock_cold_2();
LAB_0016455d:
    run_test_thread_rwlock_trylock_cold_3();
LAB_00164562:
    run_test_thread_rwlock_trylock_cold_4();
LAB_00164567:
    run_test_thread_rwlock_trylock_cold_5();
LAB_0016456c:
    run_test_thread_rwlock_trylock_cold_6();
LAB_00164571:
    run_test_thread_rwlock_trylock_cold_7();
LAB_00164576:
    run_test_thread_rwlock_trylock_cold_8();
LAB_0016457b:
    run_test_thread_rwlock_trylock_cold_9();
LAB_00164580:
    run_test_thread_rwlock_trylock_cold_10();
  }
  run_test_thread_rwlock_trylock_cold_11();
  uv_mutex_lock(&::mutex);
  iVar1 = uv_rwlock_tryrdlock(&rwlock);
  if (iVar1 == -0x10) {
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != -0x10) goto LAB_00164660;
    synchronize();
    iVar1 = uv_rwlock_tryrdlock(&rwlock);
    if (iVar1 != 0) goto LAB_00164665;
    uv_rwlock_rdunlock(&rwlock);
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != -0x10) goto LAB_0016466a;
    synchronize();
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 == 0) {
      synchronize();
      uv_rwlock_wrunlock(&rwlock);
      iVar1 = uv_rwlock_tryrdlock(&rwlock);
      if (iVar1 == 0) {
        synchronize();
        uv_rwlock_rdunlock(&rwlock);
        step = step + 1;
        uv_cond_signal(&condvar);
        iVar1 = uv_mutex_unlock(&::mutex);
        return iVar1;
      }
      goto LAB_00164674;
    }
  }
  else {
    thread_rwlock_trylock_peer_cold_1();
LAB_00164660:
    thread_rwlock_trylock_peer_cold_2();
LAB_00164665:
    thread_rwlock_trylock_peer_cold_3();
LAB_0016466a:
    thread_rwlock_trylock_peer_cold_4();
  }
  thread_rwlock_trylock_peer_cold_5();
LAB_00164674:
  thread_rwlock_trylock_peer_cold_6();
  step = step + 1;
  uv_cond_signal(&condvar);
  iVar1 = step;
  do {
    uv_cond_wait(&condvar,&::mutex);
  } while (iVar1 == step);
  if (step == iVar1 + 1) {
    return step;
  }
  synchronize_cold_1();
  return 0;
}

Assistant:

TEST_IMPL(thread_mutex) {
  uv_mutex_t mutex;
  int r;

  r = uv_mutex_init(&mutex);
  ASSERT(r == 0);

  uv_mutex_lock(&mutex);
  uv_mutex_unlock(&mutex);
  uv_mutex_destroy(&mutex);

  return 0;
}